

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O1

void __thiscall TargetImageWidget::onSaveImageRequested(TargetImageWidget *this)

{
  int *piVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString fileName;
  undefined1 local_90 [24];
  QArrayData *local_78 [2];
  qreal local_68;
  QArrayData *local_58 [2];
  qreal local_48;
  QArrayData *local_40 [3];
  undefined1 local_28 [24];
  
  QVar2.m_data = (storage_type *)0xc;
  QVar2.m_size = (qsizetype)local_90;
  QString::fromUtf8(QVar2);
  local_58[0] = (QArrayData *)CONCAT44(local_90._4_4_,local_90._0_4_);
  local_48 = (qreal)local_90._16_8_;
  QVar3.m_data = (storage_type *)0x0;
  QVar3.m_size = (qsizetype)local_90;
  QString::fromUtf8(QVar3);
  local_78[0] = (QArrayData *)CONCAT44(local_90._4_4_,local_90._0_4_);
  local_68 = (qreal)local_90._16_8_;
  QVar4.m_data = (storage_type *)0x1a;
  QVar4.m_size = (qsizetype)local_90;
  QString::fromUtf8(QVar4);
  local_28._0_4_ = local_90._0_4_;
  local_28._4_4_ = local_90._4_4_;
  local_28._8_4_ = local_90._8_4_;
  local_28._12_4_ = local_90._12_4_;
  local_28._16_8_ = local_90._16_8_;
  QFileDialog::getSaveFileName(local_40,this,local_58,local_78,local_28,0,0);
  piVar1 = (int *)CONCAT44(local_28._4_4_,local_28._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_28._4_4_,local_28._0_4_),2,8);
    }
  }
  if (local_78[0] != (QArrayData *)0x0) {
    LOCK();
    (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78[0],2,8);
    }
  }
  if (local_58[0] != (QArrayData *)0x0) {
    LOCK();
    (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58[0],2,8);
    }
  }
  GetImageInViewTargetArea((TargetImageWidget *)local_90);
  QImage::save((QString *)local_90,(char *)local_40,0);
  QImage::~QImage((QImage *)local_90);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  return;
}

Assistant:

void TargetImageWidget::onSaveImageRequested()
{
    QString fileName = QFileDialog::getSaveFileName(this, "Select Image", "", "Images (*.png *.xpm *.jpg)");
    GetImageInViewTargetArea().save(fileName);
}